

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

void Opa_ManMoveOne(Opa_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanin)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *p_00;
  int local_40;
  int i;
  int iTemp;
  Vec_Int_t *vPartFan;
  Vec_Int_t *vPartObj;
  int iFanin;
  int iObj;
  Gia_Obj_t *pFanin_local;
  Gia_Obj_t *pObj_local;
  Opa_Man_t *p_local;
  
  iVar2 = Gia_ObjId(p->pGia,pObj);
  iVar3 = Gia_ObjId(p->pGia,pFanin);
  if (iVar3 != 0) {
    if (p->pId2Part[iVar2] < 0) {
      __assert_fail("p->pId2Part[ iObj ] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCone.c"
                    ,0x88,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    if (p->pId2Part[iVar3] == -1) {
      p->pId2Part[iVar3] = p->pId2Part[iVar2];
      Vec_IntPush(p->pvParts + p->pId2Part[iVar2],iVar3);
      iVar4 = Gia_ObjIsCi(pFanin);
      if ((iVar4 == 0) && (iVar4 = Gia_ObjIsAnd(pFanin), iVar4 == 0)) {
        __assert_fail("Gia_ObjIsCi(pFanin) || Gia_ObjIsAnd(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCone.c"
                      ,0x8d,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
      }
      iVar4 = Gia_ObjIsAnd(pFanin);
      if (iVar4 == 0) {
        iVar3 = Gia_ObjIsRo(p->pGia,pFanin);
        if (iVar3 != 0) {
          pObj_00 = Gia_ObjRoToRi(p->pGia,pFanin);
          iVar3 = Gia_ObjId(p->pGia,pObj_00);
          if (p->pId2Part[iVar3] != -1) {
            __assert_fail("p->pId2Part[ iFanin ] == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCone.c"
                          ,0x94,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
          }
          p->pId2Part[iVar3] = p->pId2Part[iVar2];
          Vec_IntPush(p->pvParts + p->pId2Part[iVar2],iVar3);
          Vec_IntPush(p->vFront,iVar3);
        }
      }
      else {
        Vec_IntPush(p->vFront,iVar3);
      }
    }
    else if (p->pId2Part[iVar2] != p->pId2Part[iVar3]) {
      p_00 = p->pvParts + p->pId2Part[iVar2];
      pVVar1 = p->pvParts;
      iVar2 = p->pId2Part[iVar3];
      iVar4 = Vec_IntSize(p_00);
      if (iVar4 < 1) {
        __assert_fail("Vec_IntSize(vPartObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCone.c"
                      ,0xa1,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
      }
      for (local_40 = 0; iVar4 = Vec_IntSize(p_00), local_40 < iVar4; local_40 = local_40 + 1) {
        iVar4 = Vec_IntEntry(p_00,local_40);
        Vec_IntPush(pVVar1 + iVar2,iVar4);
        p->pId2Part[iVar4] = p->pId2Part[iVar3];
      }
      Vec_IntShrink(p_00,0);
      p->nParts = p->nParts + -1;
    }
  }
  return;
}

Assistant:

void Opa_ManMoveOne( Opa_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanin )
{
    int iObj   = Gia_ObjId(p->pGia, pObj);
    int iFanin = Gia_ObjId(p->pGia, pFanin);
    if ( iFanin == 0 )
        return;
    assert( p->pId2Part[ iObj ] >= 0 );
    if ( p->pId2Part[ iFanin ] == -1 )
    {
        p->pId2Part[ iFanin ] = p->pId2Part[ iObj ];
        Vec_IntPush( p->pvParts + p->pId2Part[ iObj ], iFanin );
        assert( Gia_ObjIsCi(pFanin) || Gia_ObjIsAnd(pFanin) );
        if ( Gia_ObjIsAnd(pFanin) )
            Vec_IntPush( p->vFront, iFanin );
        else if ( Gia_ObjIsRo(p->pGia, pFanin) )
        {
            pFanin = Gia_ObjRoToRi(p->pGia, pFanin);
            iFanin = Gia_ObjId(p->pGia, pFanin);
            assert( p->pId2Part[ iFanin ] == -1 );
            p->pId2Part[ iFanin ] = p->pId2Part[ iObj ];
            Vec_IntPush( p->pvParts + p->pId2Part[ iObj ], iFanin );
            Vec_IntPush( p->vFront, iFanin );
        }
    }
    else if ( p->pId2Part[ iObj ] != p->pId2Part[ iFanin ] )
    {
        Vec_Int_t * vPartObj = p->pvParts + p->pId2Part[ iObj ];
        Vec_Int_t * vPartFan = p->pvParts + p->pId2Part[ iFanin ];
        int iTemp, i;
//        printf( "Moving %d to %d (%d -> %d)\n", iObj, iFanin, Vec_IntSize(vPartObj), Vec_IntSize(vPartFan) );
        // add group of iObj to group of iFanin
        assert( Vec_IntSize(vPartObj) > 0 );
        Vec_IntForEachEntry( vPartObj, iTemp, i )
        {
            Vec_IntPush( vPartFan, iTemp );
            p->pId2Part[ iTemp ] = p->pId2Part[ iFanin ];
        }
        Vec_IntShrink( vPartObj, 0 );
        p->nParts--;
    }
}